

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

BBox * __thiscall CMU462::DynamicScene::Scene::get_bbox(BBox *__return_storage_ptr__,Scene *this)

{
  _Base_ptr p_Var1;
  BBox BStack_68;
  
  BBox::BBox(__return_storage_ptr__);
  for (p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x20))(&BStack_68);
    BBox::expand(__return_storage_ptr__,&BStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Scene::get_bbox() {
  BBox bbox;
  for (SceneObject *obj : objects) {
    bbox.expand(obj->get_bbox());
  }
  return bbox;
}